

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)

{
  ImGuiWindow **ppIVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *g;
  ImGuiWindow *pIVar4;
  ImGuiWindow *pIVar5;
  bool bVar6;
  
  pIVar2 = GImGui->HoveredWindow;
  if (pIVar2 == (ImGuiWindow *)0x0) {
    return false;
  }
  if ((flags & 4U) == 0) {
    pIVar3 = GImGui->CurrentWindow;
    pIVar4 = pIVar3;
    if (pIVar3 != (ImGuiWindow *)0x0 && (flags & 2U) != 0) {
      do {
        pIVar3 = pIVar4->RootWindow;
        if ((flags & 8U) == 0) {
          pIVar3 = pIVar3->RootWindowPopupTree;
        }
        bVar6 = pIVar4 != pIVar3;
        pIVar4 = pIVar3;
      } while (bVar6);
    }
    pIVar4 = pIVar2;
    if ((flags & 1U) == 0) {
      bVar6 = pIVar2 == pIVar3;
    }
    else {
      do {
        pIVar5 = pIVar4->RootWindow;
        if ((flags & 8U) == 0) {
          pIVar5 = pIVar5->RootWindowPopupTree;
        }
        bVar6 = pIVar4 != pIVar5;
        pIVar4 = pIVar5;
      } while (bVar6);
      pIVar4 = pIVar2;
      if (pIVar5 == pIVar3) goto LAB_001f4092;
      while ((bVar6 = pIVar4 == pIVar3, !bVar6 && (pIVar4 != pIVar5))) {
        ppIVar1 = &pIVar4->ParentWindow;
        pIVar4 = *ppIVar1;
        if (*ppIVar1 == (ImGuiWindow *)0x0) {
          return false;
        }
      }
    }
    if (!bVar6) {
      return false;
    }
  }
LAB_001f4092:
  if (((((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
        (pIVar3 = GImGui->NavWindow->RootWindow, pIVar3 == (ImGuiWindow *)0x0)) ||
       (pIVar3->WasActive != true)) || (pIVar4 = pIVar2->RootWindow, pIVar3 == pIVar4)) ||
     (((((uint)pIVar3->Flags >> 0x1b & 1) == 0 &&
       (((flags & 0x20U) != 0 || ((pIVar3->Flags & 0x4000000U) == 0)))) ||
      (pIVar4->RootWindow == pIVar3)))) {
LAB_001f40f8:
    if (((-1 < (char)flags) && (GImGui->ActiveId != 0)) &&
       ((GImGui->ActiveIdAllowOverlap == false && (GImGui->ActiveId != pIVar2->MoveId)))) {
      return false;
    }
    bVar6 = true;
  }
  else {
    if (pIVar4 == (ImGuiWindow *)0x0) {
      return false;
    }
    bVar6 = false;
    do {
      if (pIVar4 == pIVar3) goto LAB_001f40f8;
      pIVar4 = pIVar4->ParentWindowInBeginStack;
    } while (pIVar4 != (ImGuiWindow *)0x0);
  }
  return bVar6;
}

Assistant:

bool ImGui::IsWindowHovered(ImGuiHoveredFlags flags)
{
    IM_ASSERT((flags & (ImGuiHoveredFlags_AllowWhenOverlapped | ImGuiHoveredFlags_AllowWhenDisabled)) == 0);   // Flags not supported by this function
    ImGuiContext& g = *GImGui;
    ImGuiWindow* ref_window = g.HoveredWindow;
    ImGuiWindow* cur_window = g.CurrentWindow;
    if (ref_window == NULL)
        return false;

    if ((flags & ImGuiHoveredFlags_AnyWindow) == 0)
    {
        IM_ASSERT(cur_window); // Not inside a Begin()/End()
        const bool popup_hierarchy = (flags & ImGuiHoveredFlags_NoPopupHierarchy) == 0;
        if (flags & ImGuiHoveredFlags_RootWindow)
            cur_window = GetCombinedRootWindow(cur_window, popup_hierarchy);

        bool result;
        if (flags & ImGuiHoveredFlags_ChildWindows)
            result = IsWindowChildOf(ref_window, cur_window, popup_hierarchy);
        else
            result = (ref_window == cur_window);
        if (!result)
            return false;
    }

    if (!IsWindowContentHoverable(ref_window, flags))
        return false;
    if (!(flags & ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        if (g.ActiveId != 0 && !g.ActiveIdAllowOverlap && g.ActiveId != ref_window->MoveId)
            return false;
    return true;
}